

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# queue_generic_tests.h
# Opt level: O2

reentrant_put_transaction<void> *
density_tests::detail::
PutUInt16<density::sp_heter_queue<density_tests::TestRuntimeTime<density::runtime_type<density::feature_list<density::f_size,_density::f_alignment,_density::f_copy_construct,_density::f_move_construct,_density::f_rtti,_density::f_destroy>_>_>,_density_tests::DeepTestAllocator<65536UL>,_(density::concurrency_cardinality)1,_(density::concurrency_cardinality)0,_density::default_busy_wait>_>
::reentrant_put(reentrant_put_transaction<void> *__return_storage_ptr__,
               conc_heter_queue<density::runtime_type<>,_density_tests::UnmovableFastTestAllocator<65536UL>_>
               *i_queue,EasyRandom *param_2)

{
  ElementType_conflict val;
  reentrant_put_transaction<unsigned_short> transaction;
  unsigned_short local_5a;
  reentrant_put_transaction<unsigned_short> local_58;
  reentrant_put_transaction<unsigned_short> local_38;
  
  local_5a = 0x10;
  density::
  sp_heter_queue<density_tests::TestRuntimeTime<density::runtime_type<density::feature_list<density::f_size,density::f_alignment,density::f_copy_construct,density::f_move_construct,density::f_rtti,density::f_destroy>>>,density_tests::DeepTestAllocator<65536ul>,(density::concurrency_cardinality)1,(density::concurrency_cardinality)0,density::default_busy_wait>
  ::start_reentrant_push<unsigned_short&>
            (&local_38,
             (sp_heter_queue<density_tests::TestRuntimeTime<density::runtime_type<density::feature_list<density::f_size,density::f_alignment,density::f_copy_construct,density::f_move_construct,density::f_rtti,density::f_destroy>>>,density_tests::DeepTestAllocator<65536ul>,(density::concurrency_cardinality)1,(density::concurrency_cardinality)0,density::default_busy_wait>
              *)i_queue,&local_5a);
  local_58.m_put.m_user_storage = local_38.m_put.m_user_storage;
  local_58.m_put.m_control_block = local_38.m_put.m_control_block;
  local_58.m_put.m_next_ptr = local_38.m_put.m_next_ptr;
  local_58.m_queue = local_38.m_queue;
  local_38.m_put.m_user_storage = (void *)0x0;
  density::
  sp_heter_queue<density_tests::TestRuntimeTime<density::runtime_type<density::feature_list<density::f_size,_density::f_alignment,_density::f_copy_construct,_density::f_move_construct,_density::f_rtti,_density::f_destroy>_>_>,_density_tests::DeepTestAllocator<65536UL>,_(density::concurrency_cardinality)1,_(density::concurrency_cardinality)0,_density::default_busy_wait>
  ::reentrant_put_transaction<unsigned_short>::~reentrant_put_transaction(&local_38);
  exception_checkpoint();
  (__return_storage_ptr__->m_put).m_user_storage = local_58.m_put.m_user_storage;
  (__return_storage_ptr__->m_put).m_control_block = local_58.m_put.m_control_block;
  (__return_storage_ptr__->m_put).m_next_ptr = local_58.m_put.m_next_ptr;
  __return_storage_ptr__->m_queue = local_38.m_queue;
  local_58.m_put.m_user_storage = (void *)0x0;
  density::
  sp_heter_queue<density_tests::TestRuntimeTime<density::runtime_type<density::feature_list<density::f_size,_density::f_alignment,_density::f_copy_construct,_density::f_move_construct,_density::f_rtti,_density::f_destroy>_>_>,_density_tests::DeepTestAllocator<65536UL>,_(density::concurrency_cardinality)1,_(density::concurrency_cardinality)0,_density::default_busy_wait>
  ::reentrant_put_transaction<unsigned_short>::~reentrant_put_transaction(&local_58);
  return __return_storage_ptr__;
}

Assistant:

static typename QUEUE::template reentrant_put_transaction<void>
              reentrant_put(QUEUE & i_queue, EasyRandom &)
            {
                ElementType val         = 16;
                auto        transaction = i_queue.start_reentrant_push(val);
                exception_checkpoint();
                return std::move(transaction);
            }